

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

void __thiscall ON_SubDMeshImpl::SealEdges(ON_SubDMeshImpl *this)

{
  ulong uVar1;
  undefined1 auVar2 [4];
  bool bVar3;
  byte bVar4;
  uint uVar5;
  ON_SubDLimitMeshSealEdgeInfo *pOVar6;
  uint local_54;
  uchar src_half_mask;
  uint i0;
  uint fe_list_count;
  uint local_3c;
  undefined1 auStack_38 [4];
  uint grid_side_dex;
  ON_SubDLimitMeshSealEdgeInfo fe;
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list;
  ON_SubDMeshImpl *this_local;
  
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::ON_SimpleArray
            ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,
             (ulong)this->m_fragment_count);
  ON_SubDLimitMeshSealEdgeInfo::ON_SubDLimitMeshSealEdgeInfo
            ((ON_SubDLimitMeshSealEdgeInfo *)auStack_38);
  for (fe._0_8_ = this->m_first_fragment; fe._0_8_ != 0; fe._0_8_ = *(undefined8 *)(fe._0_8_ + 0x18)
      ) {
    if (*(long *)(fe._0_8_ + 8) != 0) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        bVar3 = ON_SubDLimitMeshSealEdgeInfo::SetEdge
                          ((ON_SubDLimitMeshSealEdgeInfo *)auStack_38,local_3c);
        if (bVar3) {
          ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::Append
                    ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,
                     (ON_SubDLimitMeshSealEdgeInfo *)auStack_38);
        }
      }
    }
  }
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::QuickSort
            ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,
             ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  uVar5 = ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::UnsignedCount
                    ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment);
  local_54 = 0;
  while (local_54 < uVar5) {
    pOVar6 = ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::operator[]
                       ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,local_54);
    auStack_38 = (undefined1  [4])pOVar6->m_edge_id;
    unique0x00012004 = pOVar6->m_bits;
    unique0x00012005 = pOVar6->m_grid_side_dex;
    unique0x00012006 = pOVar6->m_face_edge_count;
    fe._0_8_ = pOVar6->m_fragment;
    uVar1 = _auStack_38 & 0xc000000000;
    bVar4 = unique0x00012004 & 0xc0;
    while( true ) {
      local_54 = local_54 + 1;
      bVar3 = false;
      if (local_54 < uVar5) {
        auVar2 = auStack_38;
        pOVar6 = ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::operator[]
                           ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,local_54)
        ;
        bVar3 = auVar2 == (undefined1  [4])pOVar6->m_edge_id;
      }
      if ((!bVar3) ||
         ((uVar1 != 0 &&
          (pOVar6 = ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::operator[]
                              ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,
                               local_54), (bVar4 & pOVar6->m_bits) == 0)))) break;
      pOVar6 = ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::operator[]
                         ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment,local_54);
      ON_SubDLimitMeshSealEdgeInfo::Seal((ON_SubDLimitMeshSealEdgeInfo *)auStack_38,pOVar6);
    }
  }
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo>::~ON_SimpleArray
            ((ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> *)&fe.m_fragment);
  return;
}

Assistant:

void ON_SubDMeshImpl::SealEdges()
{
  ON_SimpleArray<ON_SubDLimitMeshSealEdgeInfo> fe_list(m_fragment_count);
  ON_SubDLimitMeshSealEdgeInfo fe;
  for (fe.m_fragment = m_first_fragment; nullptr != fe.m_fragment; fe.m_fragment = fe.m_fragment->m_next_fragment)
  {
    if (nullptr == fe.m_fragment->m_face)
      continue;
    for (unsigned int grid_side_dex = 0; grid_side_dex < 4; grid_side_dex++)
    {
      if ( fe.SetEdge(grid_side_dex) )
        fe_list.Append(fe);
    }
  }

  fe_list.QuickSort(ON_SubDLimitMeshSealEdgeInfo::CompareEdgeIdBitsFaceId);
  const unsigned int fe_list_count = fe_list.UnsignedCount();
  unsigned int i0 = 0;
  while ( i0 < fe_list_count )
  {
    fe = fe_list[i0];
    const unsigned char src_half_mask = (fe.m_bits & ON_SubDLimitMeshSealEdgeInfo::Bits::HalfMask);
    for ( i0++; i0 < fe_list_count && fe.m_edge_id == fe_list[i0].m_edge_id; i0++ )
    {
      if (0 != src_half_mask && 0 == (src_half_mask & fe_list[i0].m_bits))
        break; // necessary when all faces attached to an edge are not quads.
      ON_SubDLimitMeshSealEdgeInfo::Seal(fe, fe_list[i0]);
    }
  }
}